

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5ExprNodeFirst(Fts5Expr *pExpr,Fts5ExprNode *pNode)

{
  Fts5IndexIter **ppIter;
  Fts5ExprNearset *pFVar1;
  Fts5ExprPhrase *pFVar2;
  Fts5Index *p;
  char *__s;
  Fts5ExprNode *pNode_00;
  Fts5IndexIter *pFVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  long lVar9;
  Fts5ExprTerm *pFVar10;
  long lVar11;
  int local_60;
  
  pNode->bEof = 0;
  pNode->bNomatch = 0;
  if ((pNode->eType == 9) || (pNode->eType == 4)) {
    pFVar1 = pNode->pNear;
    if (0 < pFVar1->nPhrase) {
      lVar9 = 0;
      do {
        pFVar2 = pFVar1->apPhrase[lVar9];
        iVar7 = pFVar2->nTerm;
        if (iVar7 == 0) {
          pNode->bEof = 1;
          bVar4 = false;
          local_60 = 0;
        }
        else {
          bVar4 = iVar7 < 1;
          if (0 < iVar7) {
            lVar11 = 0;
            do {
              bVar4 = false;
              pFVar10 = pFVar2->aTerm + lVar11;
              do {
                ppIter = &pFVar10->pIter;
                if (pFVar10->pIter != (Fts5IndexIter *)0x0) {
                  sqlite3Fts5IterClose(pFVar10->pIter);
                  *ppIter = (Fts5IndexIter *)0x0;
                }
                p = pExpr->pIndex;
                __s = pFVar10->zTerm;
                sVar8 = strlen(__s);
                iVar6 = sqlite3Fts5IndexQuery
                                  (p,__s,(int)sVar8,
                                   (uint)(pFVar2->aTerm[lVar11].bPrefix != '\0') +
                                   (uint)(pExpr->bDesc != 0) * 2,pFVar1->pColset,ppIter);
                iVar7 = iVar6;
                if ((iVar6 == 0) && (iVar7 = local_60, (*ppIter)->bEof == '\0')) {
                  bVar4 = true;
                }
                local_60 = iVar7;
                if (iVar6 != 0) {
                  bVar5 = false;
                  goto LAB_001c9f52;
                }
                pFVar10 = pFVar10->pSynonym;
              } while (pFVar10 != (Fts5ExprTerm *)0x0);
              bVar5 = true;
              if (!bVar4) {
                pNode->bEof = 1;
                bVar5 = false;
                local_60 = 0;
              }
LAB_001c9f52:
              if (!bVar5) {
                bVar4 = false;
                break;
              }
              lVar11 = lVar11 + 1;
              bVar4 = pFVar2->nTerm <= lVar11;
            } while (lVar11 < pFVar2->nTerm);
          }
        }
        if (!bVar4) goto LAB_001ca071;
        lVar9 = lVar9 + 1;
      } while (lVar9 < pFVar1->nPhrase);
    }
    pNode->bEof = 0;
  }
  else {
    if (pNode->xNext != (_func_int_Fts5Expr_ptr_Fts5ExprNode_ptr_int_i64 *)0x0) {
      iVar7 = pNode->nChild;
      iVar6 = 0;
      if (iVar7 < 1) {
        local_60 = 0;
        iVar6 = 0;
      }
      else {
        lVar9 = 6;
        do {
          pNode_00 = pNode->apChild[lVar9 + -6];
          local_60 = fts5ExprNodeFirst(pExpr,pNode_00);
          iVar6 = iVar6 + pNode_00->bEof;
          iVar7 = pNode->nChild;
          if ((long)iVar7 <= lVar9 + -5) break;
          lVar9 = lVar9 + 1;
        } while (local_60 == 0);
      }
      pNode->iRowid = pNode->apChild[0]->iRowid;
      if (pNode->eType == 1) {
        if (iVar7 == iVar6) {
          fts5ExprSetEof(pNode);
        }
      }
      else if (pNode->eType == 2) {
        if (0 < iVar6) {
          fts5ExprSetEof(pNode);
        }
      }
      else {
        pNode->bEof = pNode->apChild[0]->bEof;
      }
      goto LAB_001ca071;
    }
    pNode->bEof = 1;
  }
  local_60 = 0;
LAB_001ca071:
  if ((local_60 == 0) && (local_60 = 0, pNode->bEof == 0)) {
    switch(pNode->eType) {
    case 1:
      fts5ExprNodeTest_OR(pExpr,pNode);
      break;
    case 2:
      iVar7 = fts5ExprNodeTest_AND(pExpr,pNode);
      return iVar7;
    default:
      iVar7 = fts5ExprNodeTest_NOT(pExpr,pNode);
      return iVar7;
    case 4:
      pFVar2 = pNode->pNear->apPhrase[0];
      pFVar3 = pFVar2->aTerm[0].pIter;
      iVar7 = pFVar3->nData;
      (pFVar2->poslist).n = iVar7;
      if (pExpr->pConfig->eDetail == 0) {
        (pFVar2->poslist).p = pFVar3->pData;
      }
      pNode->iRowid = pFVar3->iRowid;
      pNode->bNomatch = (uint)(iVar7 == 0);
      break;
    case 9:
      iVar7 = fts5ExprNodeTest_STRING(pExpr,pNode);
      return iVar7;
    }
    local_60 = 0;
  }
  return local_60;
}

Assistant:

static int fts5ExprNodeFirst(Fts5Expr *pExpr, Fts5ExprNode *pNode){
  int rc = SQLITE_OK;
  pNode->bEof = 0;
  pNode->bNomatch = 0;

  if( Fts5NodeIsString(pNode) ){
    /* Initialize all term iterators in the NEAR object. */
    rc = fts5ExprNearInitAll(pExpr, pNode);
  }else if( pNode->xNext==0 ){
    pNode->bEof = 1;
  }else{
    int i;
    int nEof = 0;
    for(i=0; i<pNode->nChild && rc==SQLITE_OK; i++){
      Fts5ExprNode *pChild = pNode->apChild[i];
      rc = fts5ExprNodeFirst(pExpr, pNode->apChild[i]);
      assert( pChild->bEof==0 || pChild->bEof==1 );
      nEof += pChild->bEof;
    }
    pNode->iRowid = pNode->apChild[0]->iRowid;

    switch( pNode->eType ){
      case FTS5_AND:
        if( nEof>0 ) fts5ExprSetEof(pNode);
        break;

      case FTS5_OR:
        if( pNode->nChild==nEof ) fts5ExprSetEof(pNode);
        break;

      default:
        assert( pNode->eType==FTS5_NOT );
        pNode->bEof = pNode->apChild[0]->bEof;
        break;
    }
  }

  if( rc==SQLITE_OK ){
    rc = fts5ExprNodeTest(pExpr, pNode);
  }
  return rc;
}